

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

double Logger::log(double __x)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  element_type *this;
  uint uVar5;
  char in_AL;
  uint uVar6;
  ulong *puVar7;
  LogEvent *this_00;
  long *in_RCX;
  ulong uVar8;
  ulong uVar9;
  long *in_RDX;
  uint __len;
  uint uVar10;
  ulong __val;
  uint32_t in_ESI;
  Level in_EDI;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  int iVar11;
  long lVar12;
  ulong uVar13;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_02;
  va_list valist;
  ptr event;
  string parmString;
  string content;
  undefined8 local_218;
  ulong *local_210;
  undefined1 local_200 [32];
  uint32_t local_1e0;
  Level local_1dc;
  element_type *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1d0;
  undefined1 local_1c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  undefined8 local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 *local_198;
  long local_190;
  undefined1 local_188 [16];
  ptr local_178;
  ptr local_168;
  SP_Appender local_158;
  ulong local_140;
  pthread_t local_138;
  long *local_130;
  string local_128;
  string local_108;
  ulong local_e8 [6];
  double local_b8;
  
  if (in_AL != '\0') {
    local_b8 = __x;
  }
  if ((int)m_level <= (int)in_EDI) {
    local_1e0 = in_ESI;
    local_1dc = in_EDI;
    local_130 = in_RDX;
    local_138 = pthread_self();
    uVar13 = 0;
    local_140 = time((time_t *)0x0);
    local_198 = local_188;
    local_190 = 0;
    local_188[0] = 0;
    iVar11 = (int)in_RCX[1];
    local_210 = (ulong *)&stack0x00000008;
    local_218 = 0x3000000020;
    local_1b8 = &local_1a8;
    local_1b0 = 0;
    local_1a8._M_local_buf[0] = '\0';
    if (0 < iVar11) {
      local_1d8 = (element_type *)CONCAT44(local_1d8._4_4_,iVar11);
      __x = extraout_XMM0_Qa;
      do {
        lVar12 = (long)(int)uVar13;
        uVar8 = lVar12 + 1;
        lVar2 = *in_RCX;
        if (*(char *)(lVar2 + lVar12) != '%' || iVar11 <= (int)uVar8) {
          __x = (double)std::__cxx11::string::push_back((char)&local_198);
          uVar8 = uVar13;
          goto switchD_00104d43_caseD_65;
        }
        cVar1 = *(char *)(lVar2 + uVar8);
        switch(cVar1) {
        case 'c':
          if ((uint)local_218 < 0x29) {
            local_218 = CONCAT44(local_218._4_4_,(uint)local_218 + 8);
          }
          else {
            local_210 = local_210 + 1;
          }
LAB_00104ec9:
          __x = (double)std::__cxx11::string::push_back((char)&local_198);
          break;
        case 'd':
          uVar13 = local_218 & 0xffffffff;
          if (uVar13 < 0x29) {
            local_218 = CONCAT44(local_218._4_4_,(uint)local_218 + 8);
            puVar7 = (ulong *)((long)local_e8 + uVar13);
          }
          else {
            puVar7 = local_210;
            local_210 = local_210 + 1;
          }
          uVar10 = (uint)*puVar7;
          uVar4 = -uVar10;
          if (0 < (int)uVar10) {
            uVar4 = uVar10;
          }
          __len = 1;
          if (9 < uVar4) {
            uVar13 = (ulong)uVar4;
            uVar5 = 4;
            do {
              __len = uVar5;
              uVar6 = (uint)uVar13;
              if (uVar6 < 100) {
                __len = __len - 2;
                goto LAB_00104f7b;
              }
              if (uVar6 < 1000) {
                __len = __len - 1;
                goto LAB_00104f7b;
              }
              if (uVar6 < 10000) goto LAB_00104f7b;
              uVar13 = uVar13 / 10000;
              uVar5 = __len + 4;
            } while (99999 < uVar6);
            __len = __len + 1;
          }
LAB_00104f7b:
          local_200._0_8_ = (LogEvent *)(local_200 + 0x10);
          std::__cxx11::string::_M_construct
                    ((ulong)local_200,(char)__len - (char)((int)uVar10 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)(local_200._0_8_ + (ulong)(uVar10 >> 0x1f)),__len,uVar4);
          std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_200);
          if ((LogEvent *)local_200._0_8_ != (LogEvent *)(local_200 + 0x10)) {
            operator_delete((void *)local_200._0_8_);
          }
          iVar11 = (int)local_1d8;
          goto LAB_00104fda;
        case 'e':
        case 'g':
        case 'h':
        case 'i':
        case 'j':
        case 'k':
          break;
        case 'f':
          uVar13 = (ulong)local_218._4_4_;
          if (uVar13 < 0xa1) {
            local_218 = CONCAT44(local_218._4_4_ + 0x10,(uint)local_218);
            puVar7 = (ulong *)((long)local_e8 + uVar13);
          }
          else {
            puVar7 = local_210;
            local_210 = local_210 + 1;
          }
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     vsnprintf,0x148,"%f",*puVar7);
LAB_00104f2d:
          std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_200);
          if ((LogEvent *)local_200._0_8_ != (LogEvent *)(local_200 + 0x10)) {
            operator_delete((void *)local_200._0_8_);
          }
LAB_00104fda:
          __x = (double)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_1b8);
          break;
        case 'l':
          uVar13 = lVar12 + 2;
          if ((int)uVar13 < iVar11) {
            if (*(char *)(lVar2 + uVar13) == 'd') {
              uVar8 = local_218 & 0xffffffff;
              if (uVar8 < 0x29) {
                local_218 = CONCAT44(local_218._4_4_,(uint)local_218 + 8);
                puVar7 = (ulong *)((long)local_e8 + uVar8);
              }
              else {
                puVar7 = local_210;
                local_210 = local_210 + 1;
              }
              uVar8 = *puVar7;
              __val = -uVar8;
              if (0 < (long)uVar8) {
                __val = uVar8;
              }
              uVar10 = 1;
              if (9 < __val) {
                uVar9 = __val;
                uVar4 = 4;
                do {
                  uVar10 = uVar4;
                  if (uVar9 < 100) {
                    uVar10 = uVar10 - 2;
                    goto LAB_001050da;
                  }
                  if (uVar9 < 1000) {
                    uVar10 = uVar10 - 1;
                    goto LAB_001050da;
                  }
                  if (uVar9 < 10000) goto LAB_001050da;
                  bVar3 = 99999 < uVar9;
                  uVar9 = uVar9 / 10000;
                  uVar4 = uVar10 + 4;
                } while (bVar3);
                uVar10 = uVar10 + 1;
              }
LAB_001050da:
              local_200._0_8_ = (LogEvent *)(local_200 + 0x10);
              std::__cxx11::string::_M_construct
                        ((ulong)local_200,(char)uVar10 - (char)((long)uVar8 >> 0x3f));
              std::__detail::__to_chars_10_impl<unsigned_long_long>
                        ((char *)(local_200._0_8_ + -((long)uVar8 >> 0x3f)),uVar10,__val);
              std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_200);
              if ((LogEvent *)local_200._0_8_ != (LogEvent *)(local_200 + 0x10)) {
                operator_delete((void *)local_200._0_8_);
              }
              iVar11 = (int)local_1d8;
            }
            else {
              if (*(char *)(lVar2 + uVar13) != 'f') goto LAB_001053ac;
              uVar8 = (ulong)local_218._4_4_;
              if (uVar8 < 0xa1) {
                local_218 = CONCAT44(local_218._4_4_ + 0x10,(uint)local_218);
                puVar7 = (ulong *)((long)local_e8 + uVar8);
              }
              else {
                puVar7 = local_210;
                local_210 = local_210 + 1;
              }
              __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_200,vsnprintf,0x148,"%f",*puVar7);
              std::__cxx11::string::operator=((string *)&local_1b8,(string *)local_200);
              if ((LogEvent *)local_200._0_8_ != (LogEvent *)(local_200 + 0x10)) {
                operator_delete((void *)local_200._0_8_);
              }
            }
            __x = (double)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_1b8);
            uVar8 = uVar13 & 0xffffffff;
          }
          break;
        default:
          if (cVar1 == '%') goto LAB_00104ec9;
          if (cVar1 == 's') {
            uVar13 = local_218 & 0xffffffff;
            if (uVar13 < 0x29) {
              local_218 = CONCAT44(local_218._4_4_,(uint)local_218 + 8);
              puVar7 = (ulong *)((long)local_e8 + uVar13);
            }
            else {
              puVar7 = local_210;
              local_210 = local_210 + 1;
            }
            std::__cxx11::string::string((string *)local_200,(char *)*puVar7,(allocator *)local_1c8)
            ;
            goto LAB_00104f2d;
          }
        }
switchD_00104d43_caseD_65:
        uVar10 = (int)uVar8 + 1;
        uVar13 = (ulong)uVar10;
      } while ((int)uVar10 < iVar11);
    }
    this_00 = (LogEvent *)operator_new(0x58);
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,*local_130,local_130[1] + *local_130);
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_198,local_198 + local_190);
    LogEvent::LogEvent(this_00,local_1e0,(uint32_t)local_138,local_140 & 0xffffffff,local_1dc,
                       &local_128,&local_108);
    local_200._0_8_ = this_00;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<LogEvent*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_200 + 8),this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if (m_target == FILE) {
      local_1c8 = (undefined1  [8])operator_new(0x18);
      local_168.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_200._0_8_;
      local_168.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_200._8_8_ + 8) = *(_Atomic_word *)(local_200._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_200._8_8_ + 8) = *(_Atomic_word *)(local_200._8_8_ + 8) + 1;
        }
      }
      FileAppender::FileAppender((FileAppender *)local_1c8,&local_168);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileAppender*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8),
                 (FileAppender *)local_1c8);
      this_01._M_pi =
           local_168.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_158.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1c8;
      this_02._M_pi = _Stack_1c0._M_pi;
    }
    else {
      local_1c8 = (undefined1  [8])operator_new(0x18);
      local_178.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_200._0_8_;
      local_178.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_200._8_8_ + 8) = *(_Atomic_word *)(local_200._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_200._8_8_ + 8) = *(_Atomic_word *)(local_200._8_8_ + 8) + 1;
        }
      }
      ConsoleAppender::ConsoleAppender((ConsoleAppender *)local_1c8,&local_178);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ConsoleAppender*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8),
                 (ConsoleAppender *)local_1c8);
      this_01._M_pi =
           local_178.super___shared_ptr<LogEvent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      local_158.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1c8;
      this_02._M_pi = _Stack_1c0._M_pi;
    }
    _local_1c8 = (undefined1  [16])0x0;
    if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_1d8 = local_158.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Stack_1d0 = this_02._M_pi;
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
      local_158.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_1d8;
      this_02._M_pi = p_Stack_1d0;
    }
    this = m_threadPool.super___shared_ptr<ThreadPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_02._M_pi)->_M_use_count = (this_02._M_pi)->_M_use_count + 1;
      }
    }
    local_158.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         this_02._M_pi;
    ThreadPool::add(this,&local_158);
    __x = extraout_XMM0_Qa_00;
    if (local_158.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.super___shared_ptr<Appender,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
      __x = extraout_XMM0_Qa_01;
    }
    if (this_02._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02._M_pi);
      __x = extraout_XMM0_Qa_02;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
      __x = extraout_XMM0_Qa_03;
    }
LAB_001053ac:
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8);
      __x = extraout_XMM0_Qa_04;
    }
    if (local_198 != local_188) {
      operator_delete(local_198);
      __x = extraout_XMM0_Qa_05;
    }
  }
  return __x;
}

Assistant:

void Logger::log(LogLevel::Level level,uint32_t line,std::string funName,std::string format,...)
{
	if(level<m_level)
		return;
	uint32_t threadId=pthread_self();
	uint32_t nowTime=time(0);
	std::string content;
	int fmt_status=0;
	int formatLength=format.length();
	va_list valist;
	va_start(valist,format);
	std::string parmString;
	for(int i=0;i<formatLength;i++){
	 	if(i+1<formatLength&&format[i]=='%'){
			switch(format[++i]){
			case 'd':
				parmString=std::to_string(va_arg(valist,int));
				content.append(parmString);
				break;
			case 's':
				parmString=std::string(va_arg(valist,char*));
				content.append(parmString);
				break;
			case 'c':
				content.push_back(static_cast<char>(va_arg(valist,int)));
				break;
			case 'f':
				parmString=std::to_string(va_arg(valist,double));
				content.append(parmString);
				break;
			case 'l':
				if(i+1<formatLength){
					if(format[i+1]=='f'){
						i++;
						parmString=std::to_string(va_arg(valist,double));
						content.append(parmString);
					}
					else if(format[i+1]=='d'){
						i++;
						parmString=std::to_string(va_arg(valist,long long));
						content.append(parmString);
					}
					else
						return;
				}
				break;
			case '%':
				content.push_back('%');
				break;
			}
		}
		else{
			content.push_back(format[i]);
		}
	}
	LogEvent::ptr event(new LogEvent(line,threadId,nowTime,level,funName,content));
	Appender::ptr appender=nullptr;
	if(m_target==LogTarget::FILE){
		appender=Appender::ptr(new FileAppender(event));
	}
	else{
		appender=Appender::ptr(new ConsoleAppender(event));
	}
	m_threadPool->add(appender);
}